

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>_>
::~lexer(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>_>
         *this)

{
  std::__cxx11::string::~string((string *)&this->token_buffer);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->token_string).super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

~lexer() = default;